

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

TryEmplaceResult * __thiscall
QHash<std::pair<int,int>,std::function<bool(void_const*,void*)>>::
tryEmplace_impl<std::pair<int,int>const&,std::function<bool(void_const*,void*)>const&>
          (TryEmplaceResult *__return_storage_ptr__,
          QHash<std::pair<int,int>,std::function<bool(void_const*,void*)>> *this,pair<int,_int> *key
          ,function<bool_(const_void_*,_void_*)> *args)

{
  uchar uVar1;
  Span *pSVar2;
  long lVar3;
  size_t hash;
  Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
  *pDVar4;
  Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_> *n;
  long in_FS_OFFSET;
  bool bVar5;
  Bucket BVar6;
  Bucket local_50;
  QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)this;
  if (lVar3 == 0) {
    QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>::detach
              ((QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_> *)this);
    lVar3 = *(long *)this;
  }
  local_40.d = (Data *)0x0;
  hash = qHash<int,int>(key,*(size_t *)(lVar3 + 0x18));
  BVar6 = QHashPrivate::
          Data<QHashPrivate::Node<std::pair<int,int>,std::function<bool(void_const*,void*)>>>::
          findBucketWithHash<std::pair<int,int>>
                    (*(Data<QHashPrivate::Node<std::pair<int,int>,std::function<bool(void_const*,void*)>>>
                       **)this,key,hash);
  uVar1 = (BVar6.span)->offsets[BVar6.index];
  pDVar4 = *(Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
             **)this;
  local_50 = BVar6;
  if ((pDVar4 == (Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
                  *)0x0) || (1 < (uint)(pDVar4->ref).atomic._q_value.super___atomic_base<int>)) {
LAB_00281b49:
    QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>::operator=
              (&local_40,
               (QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_> *)this);
    pDVar4 = *(Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
               **)this;
    if (uVar1 == 0xff) {
      bVar5 = pDVar4->numBuckets >> 1 <= pDVar4->size;
    }
    else {
      bVar5 = false;
    }
    pSVar2 = pDVar4->spans;
    if (bVar5) {
      pDVar4 = QHashPrivate::
               Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
               ::detached(pDVar4,pDVar4->size + 1);
      *(Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
        **)this = pDVar4;
      local_50 = QHashPrivate::
                 Data<QHashPrivate::Node<std::pair<int,int>,std::function<bool(void_const*,void*)>>>
                 ::findBucketWithHash<std::pair<int,int>>
                           ((Data<QHashPrivate::Node<std::pair<int,int>,std::function<bool(void_const*,void*)>>>
                             *)pDVar4,key,hash);
    }
    else {
      pDVar4 = QHashPrivate::
               Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
               ::detached(pDVar4);
      *(Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
        **)this = pDVar4;
      local_50.index._0_4_ = (uint)BVar6.index & 0x7f;
      local_50.span =
           pDVar4->spans + ((((long)BVar6.span - (long)pSVar2) / 0x90 << 7 | BVar6.index) >> 7);
      local_50.index._4_4_ = 0;
    }
    if (uVar1 != 0xff) {
      pDVar4 = *(Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
                 **)this;
      goto LAB_00281c17;
    }
  }
  else {
    if (uVar1 != 0xff) goto LAB_00281c17;
    if (pDVar4->numBuckets >> 1 <= pDVar4->size) goto LAB_00281b49;
  }
  n = QHashPrivate::
      Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>::
      Bucket::insert(&local_50);
  QHashPrivate::Node<std::pair<int,int>,std::function<bool(void_const*,void*)>>::
  createInPlace<std::function<bool(void_const*,void*)>const&>(n,key,args);
  pDVar4 = *(Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
             **)this;
  pDVar4->size = pDVar4->size + 1;
LAB_00281c17:
  pSVar2 = pDVar4->spans;
  (__return_storage_ptr__->iterator).i.d = pDVar4;
  (__return_storage_ptr__->iterator).i.bucket =
       ((long)local_50.span - (long)pSVar2) / 0x90 << 7 | local_50.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }